

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_open2.c
# Opt level: O0

void test(int pristine)

{
  int iVar1;
  int iVar2;
  int iVar3;
  archive *_a;
  char *pcVar4;
  int known_option_rv;
  int halfempty_options_rv;
  archive *a;
  int pristine_local;
  
  _a = archive_write_new();
  iVar3 = 0;
  if (pristine != 0) {
    iVar3 = -0x19;
  }
  iVar1 = 0;
  if (pristine == 0) {
    archive_write_add_filter_gzip(_a);
    archive_write_set_format_iso9660(_a);
  }
  else {
    iVar1 = -0x19;
  }
  iVar2 = archive_write_set_options(_a,(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'-',0,"0",(long)iVar2,"archive_write_set_options(a, ((void*)0))",(void *)0x0
                     );
  iVar2 = archive_write_set_options(_a,"");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'.',0,"0",(long)iVar2,"archive_write_set_options(a, \"\")",(void *)0x0);
  iVar2 = archive_write_set_options(_a,"fubar:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'1',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"fubar:snafu\")",(void *)0x0);
  pcVar4 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'3',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar4,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"fubar:snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'4',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"fubar:snafu=betcha\")",(void *)0x0);
  pcVar4 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'6',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar4,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'9',-0x19,"(-25)",(long)iVar2,"archive_write_set_options(a, \"snafu\")",
                      (void *)0x0);
  pcVar4 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L';',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar4,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'<',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"snafu=betcha\")",(void *)0x0);
  pcVar4 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'>',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar4,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"iso9660:joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'A',(long)iVar1,"known_option_rv",(long)iVar2,
                      "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  if (pristine != 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'D',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar2 = archive_write_set_options(_a,"iso9660:joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'F',(long)iVar1,"known_option_rv",(long)iVar2,
                      "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  if (pristine != 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'I',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar2 = archive_write_set_options(_a,"joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'K',(long)iVar1,"known_option_rv",(long)iVar2,
                      "archive_write_set_options(a, \"joliet\")",(void *)0x0);
  if (pristine != 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'N',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar2 = archive_write_set_options(_a,"!joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'P',(long)iVar1,"known_option_rv",(long)iVar2,
                      "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
  if (pristine != 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'S',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,",");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'V',0,"0",(long)iVar1,"archive_write_set_options(a, \",\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,",,");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'W',0,"0",(long)iVar1,"archive_write_set_options(a, \",,\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,",joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'Y',(long)iVar3,"halfempty_options_rv",(long)iVar1,
                      "archive_write_set_options(a, \",joliet\")",(void *)0x0);
  if (pristine != 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'\\',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,"joliet,");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'^',(long)iVar3,"halfempty_options_rv",(long)iVar1,
                      "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
  if (pristine != 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'a',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar3 = archive_write_set_options(_a,"joliet,snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'd',-0x19,"(-25)",(long)iVar3,
                      "archive_write_set_options(a, \"joliet,snafu\")",(void *)0x0);
  if (pristine == 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'j',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  else {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'g',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar3 = archive_write_set_options(_a,"iso9660:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'm',-0x19,"(-25)",(long)iVar3,
                      "archive_write_set_options(a, \"iso9660:snafu\")",(void *)0x0);
  if (pristine == 0) {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L's',"Undefined option: `iso9660:snafu\'","\"Undefined option: `iso9660:snafu\'\"",
               pcVar4,"archive_error_string(a)",(void *)0x0,L'\0');
  }
  else {
    pcVar4 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'p',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar4,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  archive_write_free(_a);
  return;
}

Assistant:

static void
test(int formatted, archive_open_callback *o, archive_read_callback *r,
    archive_skip_callback *s, archive_close_callback *c,
    int rv, const char *msg)
{
	struct archive* a = archive_read_new();
	if (formatted)
	    assertEqualInt(ARCHIVE_OK,
		archive_read_support_format_empty(a));
	assertEqualInt(rv,
	    archive_read_open2(a, NULL, o, r, s, c));
	assertEqualString(msg, archive_error_string(a));
	archive_read_free(a);
}